

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

uint256 * ParseHashV(UniValue *v,string_view name)

{
  long lVar1;
  pointer pcVar2;
  string_view str;
  bool bVar3;
  uint uVar4;
  string *psVar5;
  uint256 *puVar6;
  size_type sVar7;
  undefined8 uVar8;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  __sv_type _Var9;
  string *strHex;
  uint expected_len;
  optional<uint256> rv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  UniValue *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *message;
  int code;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  psVar5 = UniValue::get_str_abi_cxx11_(in_stack_ffffffffffffff20);
  _Var9 = std::__cxx11::string::operator_cast_to_basic_string_view(this);
  str._M_str = (char *)this;
  str._M_len = (size_t)in_RDI;
  uint256::FromHex(str);
  bVar3 = std::optional::operator_cast_to_bool((optional<uint256> *)in_stack_ffffffffffffff18);
  if (bVar3) {
    puVar6 = std::optional<uint256>::operator*((optional<uint256> *)in_stack_ffffffffffffff18);
    pcVar2 = *(pointer *)(puVar6->super_base_blob<256U>).m_data._M_elems;
    sVar7 = *(size_type *)((puVar6->super_base_blob<256U>).m_data._M_elems + 8);
    uVar8 = *(undefined8 *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x18);
    (in_RDI->field_2)._M_allocated_capacity =
         *(size_type *)((puVar6->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar8;
    (in_RDI->_M_dataplus)._M_p = pcVar2;
    in_RDI->_M_string_length = sVar7;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return (uint256 *)this;
    }
  }
  else {
    uVar4 = base_blob<256U>::size();
    sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      (in_stack_ffffffffffffff18);
    if (sVar7 == uVar4 << 1) {
      uVar8 = __cxa_allocate_exception(0x58);
      code = (int)((ulong)in_RSI >> 0x20);
      psVar5 = (string *)_Var9._M_str;
      tinyformat::format<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
                ((char *)psVar5,(basic_string_view<char,_std::char_traits<char>_> *)_Var9._M_len,
                 in_stack_ffffffffffffff48);
      JSONRPCError(code,psVar5);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar8,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
    else {
      uVar8 = __cxa_allocate_exception(0x58);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                (in_stack_ffffffffffffff18);
      message = (string *)_Var9._M_str;
      tinyformat::
      format<std::basic_string_view<char,std::char_traits<char>>,unsigned_int,unsigned_long,std::__cxx11::string>
                (in_RSI,(basic_string_view<char,_std::char_traits<char>_> *)psVar5,(uint *)message,
                 (unsigned_long *)_Var9._M_len,in_stack_ffffffffffffff48);
      JSONRPCError((int)((ulong)in_RSI >> 0x20),message);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(uVar8,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

uint256 ParseHashV(const UniValue& v, std::string_view name)
{
    const std::string& strHex(v.get_str());
    if (auto rv{uint256::FromHex(strHex)}) return *rv;
    if (auto expected_len{uint256::size() * 2}; strHex.length() != expected_len) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be of length %d (not %d, for '%s')", name, expected_len, strHex.length(), strHex));
    }
    throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("%s must be hexadecimal string (not '%s')", name, strHex));
}